

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

string * __thiscall
chaiscript::detail::Dispatch_Engine::get_type_name_abi_cxx11_
          (string *__return_storage_ptr__,Dispatch_Engine *this,Type_Info *ti)

{
  bool bVar1;
  Type_Name_Map *this_00;
  char *__s;
  allocator<char> local_61;
  undefined4 local_60;
  reference local_50;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>
  *elem;
  const_iterator __end2;
  const_iterator __begin2;
  Type_Name_Map *__range2;
  shared_lock<chaiscript::detail::threading::shared_mutex> l;
  Type_Info *ti_local;
  Dispatch_Engine *this_local;
  
  l._8_8_ = ti;
  Catch::clara::std::shared_lock<std::shared_mutex>::shared_lock
            ((shared_lock<std::shared_mutex> *)&__range2,&this->m_mutex);
  this_00 = &(this->m_state).m_types;
  __end2 = Catch::clara::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info,_chaiscript::str_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
           ::begin(this_00);
  elem = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>
          *)Catch::clara::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info,_chaiscript::str_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
            ::end(this_00);
  do {
    bVar1 = Catch::clara::std::operator==(&__end2,(_Self *)&elem);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __s = Type_Info::bare_name((Type_Info *)l._8_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,__s,&local_61);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
LAB_008c4009:
      local_60 = 1;
      Catch::clara::std::shared_lock<std::shared_mutex>::~shared_lock
                ((shared_lock<std::shared_mutex> *)&__range2);
      return __return_storage_ptr__;
    }
    local_50 = Catch::clara::std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>
               ::operator*(&__end2);
    bVar1 = Type_Info::bare_equal(&local_50->second,(Type_Info *)l._8_8_);
    if (bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,&local_50->first);
      goto LAB_008c4009;
    }
    Catch::clara::std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

std::string get_type_name(const Type_Info &ti) const {
        chaiscript::detail::threading::shared_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);

        for (const auto &elem : m_state.m_types) {
          if (elem.second.bare_equal(ti)) {
            return elem.first;
          }
        }

        return ti.bare_name();
      }